

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

uint __thiscall llvm::APInt::getMinSignedBits(APInt *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = isNegative(this);
  if (bVar1) {
    uVar3 = this->BitWidth;
    uVar2 = countLeadingOnes(this);
    uVar3 = uVar3 - uVar2;
  }
  else {
    uVar3 = getActiveBits(this);
  }
  return uVar3 + 1;
}

Assistant:

unsigned getMinSignedBits() const {
    if (isNegative())
      return BitWidth - countLeadingOnes() + 1;
    return getActiveBits() + 1;
  }